

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::type_caster<unsigned_long,_void>::load
          (type_caster<unsigned_long,_void> *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  long lVar4;
  handle src_00;
  object tmp;
  handle local_28;
  
  if ((((src.m_ptr == (PyObject *)0x0) || ((src.m_ptr)->ob_type == (PyTypeObject *)&PyFloat_Type))
      || (iVar2 = PyType_IsSubtype((src.m_ptr)->ob_type,&PyFloat_Type), iVar2 != 0)) ||
     (((!convert && (((src.m_ptr)->ob_type->tp_flags & 0x1000000) == 0)) &&
      (iVar2 = PyIndex_Check(src.m_ptr), iVar2 == 0)))) {
    return false;
  }
  uVar3 = PyLong_AsUnsignedLong(src.m_ptr);
  if (uVar3 == 0xffffffffffffffff) {
    PyErr_Occurred();
    lVar4 = PyErr_Occurred();
    if (lVar4 != 0) {
      PyErr_Clear();
      if (!convert) {
        return false;
      }
      iVar2 = PyNumber_Check(src.m_ptr);
      if (iVar2 == 0) {
        return false;
      }
      src_00.m_ptr = (PyObject *)PyNumber_Long(src.m_ptr);
      local_28.m_ptr = src_00.m_ptr;
      PyErr_Clear();
      bVar1 = load(this,src_00,false);
      handle::dec_ref(&local_28);
      return bVar1;
    }
  }
  this->value = uVar3;
  return true;
}

Assistant:

static handle cast(const void *ptr, return_value_policy /* policy */, handle /* parent */) {
        if (ptr) {
            return capsule(ptr).release();
        }
        return none().release();
    }